

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void add_inter_to_all_wins_list
               (Am_Object *inter,float main_priority,int second_priority,int third_priority)

{
  Am_Priority_List *this;
  Am_Object local_28;
  int local_1c;
  int local_18;
  int third_priority_local;
  int second_priority_local;
  float main_priority_local;
  Am_Object *inter_local;
  
  this = all_wins_inter_list;
  local_1c = third_priority;
  local_18 = second_priority;
  third_priority_local = (int)main_priority;
  _second_priority_local = inter;
  Am_Object::Am_Object(&local_28,inter);
  Am_Priority_List::Add(this,&local_28,(float)third_priority_local,local_18,local_1c);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
add_inter_to_all_wins_list(Am_Object inter, float main_priority,
                           int second_priority, int third_priority)
{
  Am_INTER_TRACE_PRINT(
      Am_INTER_TRACE_PRIORITIES,
      "Adding inter "
          << inter << " to global list for Am_MULTI_OWNERS=true at priority ("
          << main_priority << "," << second_priority << "," << third_priority
          << ")");
  all_wins_inter_list->Add(inter, main_priority, second_priority,
                           third_priority);
}